

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void vsencoding::__vseblocks_unpack9(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  auVar3 = vpmovsxbd_avx(ZEXT416(0x7030804));
  auVar8 = vpmovsxwd_avx(ZEXT816(0x18001f8010001f0));
  auVar17 = vpmovsxbd_avx512f(_DAT_00187bc0);
  auVar18 = vpmovsxbd_avx512f(_DAT_00187bd0);
  auVar19 = vbroadcasti64x4_avx512f(_DAT_001877e0);
  auVar20 = vpbroadcastd_avx512f(ZEXT416(0x1ff));
  auVar4 = vpmovsxbd_avx(ZEXT416(0x1010606));
  auVar9 = vpmovsxwd_avx(ZEXT816(0x1fe01fe01c001c0));
  auVar5 = vpmovsxbd_avx(ZEXT416(0x4010101));
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x1f08111a030c151e));
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1b040d16));
  auVar7 = vpmovsxbd_avx(ZEXT416(0x912));
  uVar12 = bs + 0x1f >> 5;
  while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
    auVar16 = *(undefined1 (*) [16])in;
    *out = *(uint *)*(undefined1 (*) [16])in >> 0x17;
    uVar1 = *(uint *)*(undefined1 (*) [16])((long)in + 0x10);
    auVar14 = vpsllvd_avx2(auVar16,auVar3);
    auVar14 = vpand_avx(auVar14,auVar8);
    auVar21 = vpermd_avx512f(auVar19,ZEXT1664(auVar14));
    auVar22 = vpbroadcastd_avx512f();
    auVar22 = vpermt2d_avx512f(ZEXT1664(auVar16),auVar17,auVar22);
    auVar22 = vpsrlvd_avx512f(auVar22,auVar18);
    auVar23 = vpandd_avx512f(auVar22,auVar20);
    auVar21 = vpord_avx512f(auVar22,auVar21);
    auVar22._0_8_ = auVar23._0_8_;
    auVar22._8_4_ = auVar21._8_4_;
    auVar22._12_4_ = auVar23._12_4_;
    auVar22._16_4_ = auVar23._16_4_;
    auVar22._20_4_ = auVar23._20_4_;
    auVar22._24_4_ = auVar21._24_4_;
    auVar22._28_4_ = auVar23._28_4_;
    auVar22._32_4_ = auVar23._32_4_;
    auVar22._36_4_ = auVar21._36_4_;
    auVar22._40_4_ = auVar23._40_4_;
    auVar22._44_4_ = auVar23._44_4_;
    auVar22._48_4_ = auVar23._48_4_;
    auVar22._52_4_ = auVar21._52_4_;
    auVar22._56_4_ = auVar23._56_4_;
    auVar22._60_4_ = auVar23._60_4_;
    uVar2 = *(ulong *)(*(undefined1 (*) [16])((long)in + 0x10) + 0xc);
    auVar14 = vpbroadcastq_avx512vl();
    in = (uint32_t *)(*(undefined1 (*) [16])((long)in + 0x20) + 4);
    auVar21 = vmovdqu64_avx512f(auVar22);
    *(undefined1 (*) [64])(out + 1) = auVar21;
    auVar16 = vpsllvd_avx2(auVar14,auVar4);
    auVar16 = vpand_avx(auVar16,auVar9);
    auVar24._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * ZEXT416((uVar1 & 0x7f) << 2);
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar2;
    auVar14 = vpermt2d_avx512vl(auVar14,auVar5,auVar16);
    auVar16 = vpshufd_avx(auVar16,0x40);
    auVar15 = vpbroadcastd_avx512vl();
    auVar11 = vpsrlvd_avx2(auVar16,auVar6);
    auVar25._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar15;
    auVar25._16_16_ = ZEXT116(1) * auVar14;
    auVar25 = vpsrlvd_avx2(auVar25,auVar10);
    auVar24 = vpor_avx2(auVar25,auVar24);
    auVar25 = vpand_avx2(auVar25,auVar20._0_32_);
    auVar25 = vpblendd_avx2(auVar25,auVar24,0x91);
    auVar15 = auVar20._0_16_;
    auVar16 = vpand_avx(auVar11,auVar15);
    *(undefined1 (*) [32])(out + 0x11) = auVar25;
    auVar14 = vpinsrd_avx(auVar15,((uint)uVar2 & 0xf) << 5,3);
    auVar14 = vpor_avx(auVar11,auVar14);
    auVar16 = vpblendd_avx2(auVar16,auVar14,8);
    *(undefined1 (*) [16])(out + 0x19) = auVar16;
    auVar16 = vpbroadcastd_avx512vl();
    auVar16 = vpsrlvd_avx2(auVar16,auVar7);
    auVar16 = vpand_avx(auVar16,auVar15);
    *(long *)(out + 0x1d) = auVar16._0_8_;
    out[0x1f] = (uint)(uVar2 >> 0x20) & 0x1ff;
    out = out + 0x20;
  }
  return;
}

Assistant:

void __vseblocks_unpack9(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 9, --bs) {
    out[0] = in[0] >> 23;
    out[1] = (in[0] >> 14) & 0x01ff;
    out[2] = (in[0] >> 5) & 0x01ff;
    out[3] = (in[0] << 4) & 0x01ff;
    out[3] |= in[1] >> 28;
    out[4] = (in[1] >> 19) & 0x01ff;
    out[5] = (in[1] >> 10) & 0x01ff;
    out[6] = (in[1] >> 1) & 0x01ff;
    out[7] = (in[1] << 8) & 0x01ff;
    out[7] |= in[2] >> 24;
    out[8] = (in[2] >> 15) & 0x01ff;
    out[9] = (in[2] >> 6) & 0x01ff;
    out[10] = (in[2] << 3) & 0x01ff;
    out[10] |= in[3] >> 29;
    out[11] = (in[3] >> 20) & 0x01ff;
    out[12] = (in[3] >> 11) & 0x01ff;
    out[13] = (in[3] >> 2) & 0x01ff;
    out[14] = (in[3] << 7) & 0x01ff;
    out[14] |= in[4] >> 25;
    out[15] = (in[4] >> 16) & 0x01ff;
    out[16] = (in[4] >> 7) & 0x01ff;
    out[17] = (in[4] << 2) & 0x01ff;
    out[17] |= in[5] >> 30;
    out[18] = (in[5] >> 21) & 0x01ff;
    out[19] = (in[5] >> 12) & 0x01ff;
    out[20] = (in[5] >> 3) & 0x01ff;
    out[21] = (in[5] << 6) & 0x01ff;
    out[21] |= in[6] >> 26;
    out[22] = (in[6] >> 17) & 0x01ff;
    out[23] = (in[6] >> 8) & 0x01ff;
    out[24] = (in[6] << 1) & 0x01ff;
    out[24] |= in[7] >> 31;
    out[25] = (in[7] >> 22) & 0x01ff;
    out[26] = (in[7] >> 13) & 0x01ff;
    out[27] = (in[7] >> 4) & 0x01ff;
    out[28] = (in[7] << 5) & 0x01ff;
    out[28] |= in[8] >> 27;
    out[29] = (in[8] >> 18) & 0x01ff;
    out[30] = (in[8] >> 9) & 0x01ff;
    out[31] = in[8] & 0x01ff;
  }
}